

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_error.cpp
# Opt level: O2

void throw_error(int err,char *action)

{
  ostream *poVar1;
  runtime_error *this;
  char *pcVar2;
  string local_9d0 [32];
  stringstream ss;
  ostream local_9a0 [376];
  char tmp [2048];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_9a0,action);
  poVar1 = std::operator<<(poVar1," failed, error: ");
  if (err == 9) {
    pcVar2 = "EBADF";
  }
  else if (err == 0x6f) {
    pcVar2 = "ECONNREFUSED";
  }
  else if (err == 0xd) {
    pcVar2 = "EACCES";
  }
  else if (err == 0x16) {
    pcVar2 = "EINVAL";
  }
  else if (err == 0x18) {
    pcVar2 = "EMFILE";
  }
  else if (err == 0x20) {
    pcVar2 = "EPIPE";
  }
  else if (err == 0x62) {
    pcVar2 = "EADDRINUSE";
  }
  else if (err == 99) {
    pcVar2 = "EADDRNOTAVAIL";
  }
  else if (err == 0x68) {
    pcVar2 = "ECONNRESET";
  }
  else if (err == 0xb) {
    pcVar2 = "EAGAIN";
  }
  else {
    pcVar2 = "<unknown error>";
  }
  std::operator<<(poVar1,pcVar2);
  pcVar2 = strerror_r(err,tmp,0x800);
  poVar1 = std::operator<<(local_9a0," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,err);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,")");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_9d0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throw_error [[noreturn]] (int err, char const* action)
{
    std::stringstream ss;
    ss << action << " failed, error: " << error_enum_name(err);
    char tmp[2048];
    char const* err_msg = strerror_r(err, tmp, sizeof tmp);
    ss << " (" << err << ", " << err_msg << ")";
    throw std::runtime_error(ss.str());
}